

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal
          (ChElementBeamTaperedTimoshenko *this,bool inertial_damping,bool inertial_stiffness)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  ChFrame<double> *this_00;
  ChVector<double> mW_B;
  ChVector<double> mW_A;
  ChVector<double> mXacc_A;
  ChVector<double> mWvel_B;
  ChVector<double> mXacc_B;
  ChVector<double> mWacc_B;
  ChMatrixNM<double,_12,_12> mH;
  undefined1 local_5c0 [88];
  ChLoadableUVW local_568;
  ChVector<double> local_560;
  ChVector<double> local_548;
  ChVector<double> local_530;
  ChVector<double> local_518;
  ChElementBeamTaperedTimoshenko local_500 [2];
  
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    if (inertial_damping) {
      GetNodeA(local_500);
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)(local_5c0 + 0x40),
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeB(local_500);
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)(local_5c0 + 0x28),
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      peVar1 = (this->tapered_section).
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar1->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[3])
                (peVar1,local_500,local_5c0 + 0x40,local_5c0 + 0x28);
      local_560.m_data[0] = (this->super_ChElementBeam).length * 0.5;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
                        *)local_5c0,local_560.m_data,(StorageBaseType *)local_500);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,12,1,12,12>const>const,Eigen::Matrix<double,12,12,1,12,12>const>>
                (&this->Ri,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
                  *)local_5c0);
    }
    else {
      iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[3])(this);
      iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[3])(this);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                (&(this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
                 (long)iVar2,(long)iVar3);
    }
    if (inertial_stiffness) {
      GetNodeA(local_500);
      ChFrameMoving<double>::GetWvel_loc
                ((ChVector<double> *)(local_5c0 + 0x40),
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeA(local_500);
      ChFrameMoving<double>::GetWacc_loc
                ((ChVector<double> *)(local_5c0 + 0x28),
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeA(local_500);
      this_00 = (ChFrame<double> *)
                (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                 _vptr_ChElementBase + 3);
      GetNodeA((ChElementBeamTaperedTimoshenko *)local_5c0);
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_560,this_00,(ChVector<double> *)(local_5c0._0_8_ + 0xd8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeB(local_500);
      ChFrameMoving<double>::GetWvel_loc
                (&local_548,
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeB(local_500);
      ChFrameMoving<double>::GetWacc_loc
                (&local_518,
                 (ChFrameMoving<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      GetNodeB(local_500);
      GetNodeB((ChElementBeamTaperedTimoshenko *)local_5c0);
      ChFrame<double>::TransformDirectionParentToLocal
                (&local_530,
                 (ChFrame<double> *)
                 (local_500[0].super_ChElementBeam.super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + 3),(ChVector<double> *)(local_5c0._0_8_ + 0xd8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5c0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_500[0].super_ChElementBeam.super_ChElementGeneric.Kmatr);
      peVar1 = (this->tapered_section).
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar1->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[4])
                (peVar1,local_500,local_5c0 + 0x40,local_5c0 + 0x28,&local_560,&local_548,&local_518
                 ,&local_530);
      local_568 = (ChLoadableUVW)((this->super_ChElementBeam).length * 0.5);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
                        *)local_5c0,(double *)&local_568,(StorageBaseType *)local_500);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,12,1,12,12>const>const,Eigen::Matrix<double,12,12,1,12,12>const>>
                (&this->Ki,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_const_Eigen::Matrix<double,_12,_12,_1,_12,_12>_>
                  *)local_5c0);
    }
    else {
      iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[3])(this);
      iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[3])(this);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
                (&(this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
                 (long)iVar2,(long)iVar3);
    }
    return;
  }
  __assert_fail("tapered_section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x2ef,
                "void chrono::fea::ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool, bool)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeKiRimatricesLocal(bool inertial_damping, bool inertial_stiffness) {
    assert(tapered_section);

    if (inertial_damping) {
        ChVector<> mW_A = this->GetNodeA()->GetWvel_loc();
        ChVector<> mW_B = this->GetNodeB()->GetWvel_loc();
        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaDampingMatrix(mH, mW_A, mW_B);
        this->Ri = 0.5 * this->length * mH;
    } else {
        this->Ri.setZero(this->GetNdofs(), this->GetNdofs());
    }

    if (inertial_stiffness) {
        // current angular velocity of section of node A, in material frame
        ChVector<> mWvel_A = this->GetNodeA()->GetWvel_loc();
        // current angular acceleration of section of node A, in material frame
        ChVector<> mWacc_A = this->GetNodeA()->GetWacc_loc();
        // current acceleration of section of node A, in material frame)
        ChVector<> mXacc_A = this->GetNodeA()->TransformDirectionParentToLocal(this->GetNodeA()->GetPos_dtdt());
        // current angular velocity of section of node B, in material frame
        ChVector<> mWvel_B = this->GetNodeB()->GetWvel_loc();
        // current angular acceleration of section of node B, in material frame
        ChVector<> mWacc_B = this->GetNodeB()->GetWacc_loc();
        // current acceleration of section of node B, in material frame
        ChVector<> mXacc_B = this->GetNodeB()->TransformDirectionParentToLocal(this->GetNodeB()->GetPos_dtdt());

        ChMatrixNM<double, 12, 12> mH;
        this->tapered_section->ComputeInertiaStiffnessMatrix(mH, mWvel_A, mWacc_A, mXacc_A, mWvel_B, mWacc_B, mXacc_B);
        this->Ki = 0.5 * this->length * mH;
    } else {
        this->Ki.setZero(this->GetNdofs(), this->GetNdofs());
    }
}